

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::RestorePathDependentInfo
          (GlobOpt *this,PathDependentInfo *info,PathDependentInfoToRestore infoToRestore)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueInfo *pVVar4;
  Value *pVVar5;
  PathDependentInfo *info_local;
  GlobOpt *this_local;
  PathDependentInfoToRestore infoToRestore_local;
  
  infoToRestore_local.leftValueInfo = infoToRestore.rightValueInfo;
  this_local = (GlobOpt *)infoToRestore.leftValueInfo;
  if (info == (PathDependentInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x291e,"(info)","info");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pVVar4 = PathDependentInfoToRestore::LeftValueInfo((PathDependentInfoToRestore *)&this_local);
  if (pVVar4 != (ValueInfo *)0x0) {
    pVVar5 = PathDependentInfo::LeftValue(info);
    if (pVVar5 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2922,"(info->LeftValue())","info->LeftValue()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pVVar5 = PathDependentInfo::LeftValue(info);
    pVVar4 = PathDependentInfoToRestore::LeftValueInfo((PathDependentInfoToRestore *)&this_local);
    ChangeValueInfo(this,(BasicBlock *)0x0,pVVar5,pVVar4,false,false);
  }
  pVVar4 = PathDependentInfoToRestore::RightValueInfo((PathDependentInfoToRestore *)&this_local);
  if (pVVar4 != (ValueInfo *)0x0) {
    pVVar5 = PathDependentInfo::RightValue(info);
    if (pVVar5 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2928,"(info->RightValue())","info->RightValue()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pVVar5 = PathDependentInfo::RightValue(info);
    pVVar4 = PathDependentInfoToRestore::RightValueInfo((PathDependentInfoToRestore *)&this_local);
    ChangeValueInfo(this,(BasicBlock *)0x0,pVVar5,pVVar4,false,false);
  }
  return;
}

Assistant:

void
GlobOpt::RestorePathDependentInfo(PathDependentInfo *const info, const PathDependentInfoToRestore infoToRestore)
{
    Assert(info);

    if(infoToRestore.LeftValueInfo())
    {
        Assert(info->LeftValue());
        ChangeValueInfo(nullptr, info->LeftValue(), infoToRestore.LeftValueInfo());
    }

    if(infoToRestore.RightValueInfo())
    {
        Assert(info->RightValue());
        ChangeValueInfo(nullptr, info->RightValue(), infoToRestore.RightValueInfo());
    }
}